

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O2

void __thiscall chrono::ChLinkMarkers::ConstraintsFbLoadForces(ChLinkMarkers *this,double factor)

{
  ChBodyFrame *pCVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  double factor_local;
  ChVector<double> *local_128 [2];
  Vector mbody_torque;
  Vector mbody_force;
  ChVectorRef local_e0;
  ChVector<double> local_c8;
  Vector m_abs_force;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_98;
  ChVector<double> local_68 [2];
  
  if (((this->super_ChLink).Body1 != (ChBodyFrame *)0x0) &&
     ((this->super_ChLink).Body2 != (ChBodyFrame *)0x0)) {
    factor_local = factor;
    bVar2 = Vnotnull<double>(&this->C_force);
    if (bVar2) {
      mbody_force.m_data[0] = 0.0;
      mbody_force.m_data[1] = 0.0;
      mbody_force.m_data[2] = 0.0;
      mbody_torque.m_data[0] = 0.0;
      mbody_torque.m_data[1] = 0.0;
      mbody_torque.m_data[2] = 0.0;
      pCVar1 = (this->super_ChLink).Body2;
      ChMatrix33<double>::operator*
                (&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix,
                 &this->C_force);
      ChMatrix33<double>::operator*
                (&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix,local_68);
      ChBodyFrame::To_abs_forcetorque
                ((this->super_ChLink).Body2,&m_abs_force,
                 &(this->marker1->abs_frame).super_ChFrame<double>.coord.pos,false,&mbody_force,
                 &mbody_torque);
      local_e0.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _0_8_ = &mbody_force;
      Eigen::operator*(&local_98,&factor_local,(StorageBaseType *)&local_e0);
      iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                _vptr_ChFrame[0x10])();
      ChVariables::Get_fb((ChVectorRef *)&local_c8,(ChVariables *)CONCAT44(extraout_var,iVar3));
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_68,
                    (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                    &local_c8,0,3);
      Eigen::
      MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>,-1,1,false>>
      ::operator-=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                    *)local_68,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)&local_98);
      ChFrame<double>::TransformDirectionParentToLocal
                (&local_c8,(ChFrame<double> *)(this->super_ChLink).Body2,&mbody_torque);
      local_128[0] = &local_c8;
      Eigen::operator*(&local_98,&factor_local,(StorageBaseType *)local_128);
      iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                _vptr_ChFrame[0x10])();
      ChVariables::Get_fb(&local_e0,(ChVariables *)CONCAT44(extraout_var_00,iVar3));
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_68,&local_e0,3,3);
      Eigen::
      MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>,-1,1,false>>
      ::operator-=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                    *)local_68,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)&local_98);
      ChBodyFrame::To_abs_forcetorque
                ((this->super_ChLink).Body1,&m_abs_force,
                 &(this->marker1->abs_frame).super_ChFrame<double>.coord.pos,false,&mbody_force,
                 &mbody_torque);
      local_e0.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _0_8_ = &mbody_force;
      Eigen::operator*(&local_98,&factor_local,(StorageBaseType *)&local_e0);
      iVar3 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                _vptr_ChFrame[0x10])();
      ChVariables::Get_fb((ChVectorRef *)&local_c8,(ChVariables *)CONCAT44(extraout_var_01,iVar3));
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_68,
                    (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                    &local_c8,0,3);
      Eigen::
      MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>,-1,1,false>>
      ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                    *)local_68,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)&local_98);
      ChFrame<double>::TransformDirectionParentToLocal
                (&local_c8,(ChFrame<double> *)(this->super_ChLink).Body1,&mbody_torque);
      local_128[0] = &local_c8;
      Eigen::operator*(&local_98,&factor_local,(StorageBaseType *)local_128);
      iVar3 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                _vptr_ChFrame[0x10])();
      ChVariables::Get_fb(&local_e0,(ChVariables *)CONCAT44(extraout_var_02,iVar3));
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_68,&local_e0,3,3);
      Eigen::
      MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>,-1,1,false>>
      ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                    *)local_68,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)&local_98);
    }
    bVar2 = Vnotnull<double>(&this->C_torque);
    if (bVar2) {
      pCVar1 = (this->super_ChLink).Body2;
      ChMatrix33<double>::operator*
                (&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix,
                 &this->C_torque);
      ChMatrix33<double>::operator*
                (&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix,local_68);
      ChFrame<double>::TransformDirectionParentToLocal
                (&mbody_torque,(ChFrame<double> *)(this->super_ChLink).Body1,&mbody_force);
      local_c8.m_data[0] = (double)&mbody_torque;
      Eigen::operator*(&local_98,&factor_local,(StorageBaseType *)&local_c8);
      iVar3 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                _vptr_ChFrame[0x10])();
      ChVariables::Get_fb((ChVectorRef *)&m_abs_force,(ChVariables *)CONCAT44(extraout_var_03,iVar3)
                         );
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_68,
                    (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                    &m_abs_force,3,3);
      Eigen::
      MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>,-1,1,false>>
      ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                    *)local_68,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)&local_98);
      ChFrame<double>::TransformDirectionParentToLocal
                (&mbody_torque,(ChFrame<double> *)(this->super_ChLink).Body2,&mbody_force);
      local_c8.m_data[0] = (double)&mbody_torque;
      Eigen::operator*(&local_98,&factor_local,(StorageBaseType *)&local_c8);
      iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                _vptr_ChFrame[0x10])();
      ChVariables::Get_fb((ChVectorRef *)&m_abs_force,(ChVariables *)CONCAT44(extraout_var_04,iVar3)
                         );
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_68,
                    (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                    &m_abs_force,3,3);
      Eigen::
      MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>,-1,1,false>>
      ::operator-=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                    *)local_68,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)&local_98);
    }
  }
  return;
}

Assistant:

void ChLinkMarkers::ConstraintsFbLoadForces(double factor) {
    if (!Body1 || !Body2)
        return;

    if (Vnotnull(C_force)) {
        Vector mbody_force;
        Vector mbody_torque;
        Vector m_abs_force = Body2->GetA() * (marker2->GetA() * C_force);

        Body2->To_abs_forcetorque(m_abs_force,
                                  marker1->GetAbsCoord().pos,  // absolute application point is always marker1
                                  false,                       // from abs. space
                                  mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
        Body2->Variables().Get_fb().segment(0, 3) -= factor * mbody_force.eigen();
        Body2->Variables().Get_fb().segment(3, 3) -=
            factor * Body2->TransformDirectionParentToLocal(mbody_torque).eigen();

        Body1->To_abs_forcetorque(m_abs_force,
                                  marker1->GetAbsCoord().pos,  // absolute application point is always marker1
                                  false,                       // from abs. space
                                  mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
        Body1->Variables().Get_fb().segment(0, 3) += factor * mbody_force.eigen();
        Body1->Variables().Get_fb().segment(3, 3) +=
            factor * Body1->TransformDirectionParentToLocal(mbody_torque).eigen();
    }

    if (Vnotnull(C_torque)) {
        Vector m_abs_torque = Body2->GetA() * (marker2->GetA() * C_torque);
        // load torques in 'fb' vector accumulator of body variables (torques in local coords)
        Body1->Variables().Get_fb().segment(3, 3) +=
            factor * Body1->TransformDirectionParentToLocal(m_abs_torque).eigen();
        Body2->Variables().Get_fb().segment(3, 3) -=
            factor * Body2->TransformDirectionParentToLocal(m_abs_torque).eigen();
    }
}